

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3EvalNextRow(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  byte bVar1;
  Fts3Phrase *pFVar2;
  sqlite3_stmt *psVar3;
  Fts3Expr *pFVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  Fts3Expr *in_RDX;
  Fts3Cursor *in_RSI;
  long in_RDI;
  bool bVar8;
  Fts3Phrase *pPhrase;
  Fts3Expr *pRight_2;
  Fts3Expr *pLeft_2;
  sqlite3_int64 iCmp;
  Fts3Expr *pRight_1;
  Fts3Expr *pLeft_1;
  Fts3Doclist *pDl_1;
  Fts3Doclist *pDl;
  sqlite3_int64 iDiff;
  Fts3Expr *pRight;
  Fts3Expr *pLeft;
  int bDescDoclist;
  int local_b0;
  int local_a4;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  int iVar9;
  undefined4 in_stack_ffffffffffffff6c;
  undefined1 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff71;
  undefined1 in_stack_ffffffffffffff72;
  undefined1 in_stack_ffffffffffffff73;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffffe0;
  
  if ((in_RDX->eType == 0) && ((char)in_RSI->iPrevId == '\0')) {
    bVar1 = *(byte *)(in_RDI + 0x4c);
    uVar6 = (uint)bVar1;
    *(undefined1 *)((long)&in_RSI->iPrevId + 1) = 1;
    switch(*(undefined4 *)&(in_RSI->base).pVtab) {
    case 1:
    case 3:
      psVar3 = in_RSI->pStmt;
      pFVar4 = in_RSI->pExpr;
      if (psVar3[0x32] == (sqlite3_stmt)0x0) {
        if (pFVar4->bDeferred == '\0') {
          fts3EvalNextRow(in_RSI,in_RDX,(int *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
          fts3EvalNextRow(in_RSI,in_RDX,(int *)CONCAT44(uVar6,in_stack_ffffffffffffffe0));
          while( true ) {
            bVar8 = false;
            if ((psVar3[0x30] == (sqlite3_stmt)0x0) && (bVar8 = false, pFVar4->bEof == '\0')) {
              bVar8 = in_RDX->eType == 0;
            }
            if (!bVar8) break;
            iVar7 = 1;
            if (uVar6 != 0) {
              iVar7 = -1;
            }
            if (pFVar4->iDocid < *(long *)(psVar3 + 0x28)) {
              iVar9 = 1;
            }
            else {
              iVar9 = -1;
              if (*(long *)(psVar3 + 0x28) == pFVar4->iDocid) {
                iVar9 = 0;
              }
            }
            if (iVar7 * iVar9 == 0) break;
            if (iVar7 * iVar9 < 0) {
              fts3EvalNextRow(in_RSI,in_RDX,(int *)CONCAT44(uVar6,in_stack_ffffffffffffffe0));
            }
            else {
              fts3EvalNextRow(in_RSI,in_RDX,(int *)CONCAT44(uVar6,in_stack_ffffffffffffffe0));
            }
          }
          in_RSI->pDeferred = *(Fts3DeferredToken **)(psVar3 + 0x28);
          bVar8 = true;
          if (psVar3[0x30] == (sqlite3_stmt)0x0) {
            bVar8 = pFVar4->bEof != '\0';
          }
          *(bool *)&in_RSI->iPrevId = bVar8;
          if ((*(int *)&(in_RSI->base).pVtab == 1) && ((char)in_RSI->iPrevId != '\0')) {
            if ((pFVar4->pPhrase->doclist).aAll != (char *)0x0) {
              pFVar2 = pFVar4->pPhrase;
              while( true ) {
                bVar8 = false;
                if (in_RDX->eType == 0) {
                  bVar8 = pFVar4->bEof == '\0';
                }
                if (!bVar8) break;
                memset((pFVar2->doclist).pList,0,(long)(pFVar2->doclist).nList);
                fts3EvalNextRow(in_RSI,in_RDX,(int *)CONCAT44(uVar6,in_stack_ffffffffffffffe0));
              }
            }
            if ((*(long *)(psVar3 + 0x20) != 0) && (**(long **)(psVar3 + 0x20) != 0)) {
              lVar5 = *(long *)(psVar3 + 0x20);
              while( true ) {
                bVar8 = false;
                if (in_RDX->eType == 0) {
                  bVar8 = psVar3[0x30] == (sqlite3_stmt)0x0;
                }
                if (!bVar8) break;
                memset(*(void **)(lVar5 + 0x28),0,(long)*(int *)(lVar5 + 0x30));
                fts3EvalNextRow(in_RSI,in_RDX,(int *)CONCAT44(uVar6,in_stack_ffffffffffffffe0));
              }
            }
            psVar3[0x30] = (sqlite3_stmt)0x1;
            pFVar4->bEof = '\x01';
          }
        }
        else {
          fts3EvalNextRow(in_RSI,in_RDX,(int *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
          in_RSI->pDeferred = *(Fts3DeferredToken **)(psVar3 + 0x28);
          *(sqlite3_stmt *)&in_RSI->iPrevId = psVar3[0x30];
        }
      }
      else {
        fts3EvalNextRow(in_RSI,in_RDX,(int *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
        in_RSI->pDeferred = (Fts3DeferredToken *)pFVar4->iDocid;
        *(u8 *)&in_RSI->iPrevId = pFVar4->bEof;
      }
      break;
    case 2:
      psVar3 = in_RSI->pStmt;
      pFVar4 = in_RSI->pExpr;
      if (pFVar4->bStart == '\0') {
        fts3EvalNextRow(in_RSI,in_RDX,(int *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
      }
      fts3EvalNextRow(in_RSI,in_RDX,(int *)CONCAT44(uVar6,in_stack_ffffffffffffffe0));
      if (psVar3[0x30] == (sqlite3_stmt)0x0) {
        while( true ) {
          bVar8 = false;
          if ((in_RDX->eType == 0) && (bVar8 = false, pFVar4->bEof == '\0')) {
            iVar7 = 1;
            if (uVar6 != 0) {
              iVar7 = -1;
            }
            if (pFVar4->iDocid < *(long *)(psVar3 + 0x28)) {
              local_b0 = 1;
            }
            else {
              local_b0 = -1;
              if (*(long *)(psVar3 + 0x28) == pFVar4->iDocid) {
                local_b0 = 0;
              }
            }
            bVar8 = 0 < iVar7 * local_b0;
          }
          if (!bVar8) break;
          fts3EvalNextRow(in_RSI,in_RDX,(int *)CONCAT44(uVar6,in_stack_ffffffffffffffe0));
        }
      }
      in_RSI->pDeferred = *(Fts3DeferredToken **)(psVar3 + 0x28);
      *(sqlite3_stmt *)&in_RSI->iPrevId = psVar3[0x30];
      break;
    case 4:
      psVar3 = in_RSI->pStmt;
      pFVar4 = in_RSI->pExpr;
      iVar7 = 1;
      if (uVar6 != 0) {
        iVar7 = -1;
      }
      if (pFVar4->iDocid < *(long *)(psVar3 + 0x28)) {
        iVar9 = 1;
      }
      else {
        iVar9 = -1;
        if (*(long *)(psVar3 + 0x28) == pFVar4->iDocid) {
          iVar9 = 0;
        }
      }
      if ((pFVar4->bEof == '\0') && ((psVar3[0x30] != (sqlite3_stmt)0x0 || (-1 < iVar7 * iVar9)))) {
        if ((psVar3[0x30] == (sqlite3_stmt)0x0) && (iVar7 * iVar9 < 1)) {
          fts3EvalNextRow(in_RSI,in_RDX,(int *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
          fts3EvalNextRow(in_RSI,in_RDX,(int *)CONCAT44(uVar6,in_stack_ffffffffffffffe0));
        }
        else {
          fts3EvalNextRow(in_RSI,in_RDX,(int *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
        }
      }
      else {
        fts3EvalNextRow(in_RSI,in_RDX,(int *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
      }
      bVar8 = false;
      if (psVar3[0x30] != (sqlite3_stmt)0x0) {
        bVar8 = pFVar4->bEof != '\0';
      }
      *(bool *)&in_RSI->iPrevId = bVar8;
      iVar7 = 1;
      if (uVar6 != 0) {
        iVar7 = -1;
      }
      if (pFVar4->iDocid < *(long *)(psVar3 + 0x28)) {
        local_a4 = 1;
      }
      else {
        local_a4 = -1;
        if (*(long *)(psVar3 + 0x28) == pFVar4->iDocid) {
          local_a4 = 0;
        }
      }
      if ((pFVar4->bEof == '\0') && ((psVar3[0x30] != (sqlite3_stmt)0x0 || (-1 < iVar7 * local_a4)))
         ) {
        in_RSI->pDeferred = (Fts3DeferredToken *)pFVar4->iDocid;
      }
      else {
        in_RSI->pDeferred = *(Fts3DeferredToken **)(psVar3 + 0x28);
      }
      break;
    default:
      lVar5 = *(long *)&in_RSI->iLangid;
      fts3EvalInvalidatePoslist((Fts3Phrase *)0x251263);
      iVar7 = fts3EvalPhraseNext((Fts3Cursor *)
                                 CONCAT44(in_stack_ffffffffffffff74,
                                          CONCAT13(in_stack_ffffffffffffff73,
                                                   CONCAT12(in_stack_ffffffffffffff72,
                                                            CONCAT11(in_stack_ffffffffffffff71,
                                                                     in_stack_ffffffffffffff70)))),
                                 (Fts3Phrase *)
                                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                 (u8 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                                );
      in_RDX->eType = iVar7;
      in_RSI->pDeferred = *(Fts3DeferredToken **)(lVar5 + 0x18);
    }
  }
  return;
}

Assistant:

static void fts3EvalNextRow(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pExpr,                /* Expr. to advance to next matching row */
  int *pRc                        /* IN/OUT: Error code */
){
  if( *pRc==SQLITE_OK && pExpr->bEof==0 ){
    int bDescDoclist = pCsr->bDesc;         /* Used by DOCID_CMP() macro */
    pExpr->bStart = 1;

    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        assert( !pLeft->bDeferred || !pRight->bDeferred );

        if( pLeft->bDeferred ){
          /* LHS is entirely deferred. So we assume it matches every row.
          ** Advance the RHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pRight, pRc);
          pExpr->iDocid = pRight->iDocid;
          pExpr->bEof = pRight->bEof;
        }else if( pRight->bDeferred ){
          /* RHS is entirely deferred. So we assume it matches every row.
          ** Advance the LHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = pLeft->bEof;
        }else{
          /* Neither the RHS or LHS are deferred. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
          while( !pLeft->bEof && !pRight->bEof && *pRc==SQLITE_OK ){
            sqlite3_int64 iDiff = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
            if( iDiff==0 ) break;
            if( iDiff<0 ){
              fts3EvalNextRow(pCsr, pLeft, pRc);
            }else{
              fts3EvalNextRow(pCsr, pRight, pRc);
            }
          }
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = (pLeft->bEof || pRight->bEof);
          if( pExpr->eType==FTSQUERY_NEAR && pExpr->bEof ){
            assert( pRight->eType==FTSQUERY_PHRASE );
            if( pRight->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pRight->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pRight->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pRight, pRc);
              }
            }
            if( pLeft->pPhrase && pLeft->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pLeft->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pLeft->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pLeft, pRc);
              }
            }
            pRight->bEof = pLeft->bEof = 1;
          }
        }
        break;
      }

      case FTSQUERY_OR: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        sqlite3_int64 iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);

        assert_fts3_nc( pLeft->bStart || pLeft->iDocid==pRight->iDocid );
        assert_fts3_nc( pRight->bStart || pLeft->iDocid==pRight->iDocid );

        if( pRight->bEof || (pLeft->bEof==0 && iCmp<0) ){
          fts3EvalNextRow(pCsr, pLeft, pRc);
        }else if( pLeft->bEof || iCmp>0 ){
          fts3EvalNextRow(pCsr, pRight, pRc);
        }else{
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
        }

        pExpr->bEof = (pLeft->bEof && pRight->bEof);
        iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
        if( pRight->bEof || (pLeft->bEof==0 &&  iCmp<0) ){
          pExpr->iDocid = pLeft->iDocid;
        }else{
          pExpr->iDocid = pRight->iDocid;
        }

        break;
      }

      case FTSQUERY_NOT: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;

        if( pRight->bStart==0 ){
          fts3EvalNextRow(pCsr, pRight, pRc);
          assert( *pRc!=SQLITE_OK || pRight->bStart );
        }

        fts3EvalNextRow(pCsr, pLeft, pRc);
        if( pLeft->bEof==0 ){
          while( !*pRc
              && !pRight->bEof
              && DOCID_CMP(pLeft->iDocid, pRight->iDocid)>0
          ){
            fts3EvalNextRow(pCsr, pRight, pRc);
          }
        }
        pExpr->iDocid = pLeft->iDocid;
        pExpr->bEof = pLeft->bEof;
        break;
      }

      default: {
        Fts3Phrase *pPhrase = pExpr->pPhrase;
        fts3EvalInvalidatePoslist(pPhrase);
        *pRc = fts3EvalPhraseNext(pCsr, pPhrase, &pExpr->bEof);
        pExpr->iDocid = pPhrase->doclist.iDocid;
        break;
      }
    }
  }
}